

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall
CTxMemPool::UpdateTransactionsFromBlock
          (CTxMemPool *this,vector<uint256,_std::allocator<uint256>_> *vHashesToUpdate)

{
  __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> __last;
  undefined1 uVar1;
  bool bVar2;
  CTxMemPool *this_00;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar3;
  size_type sVar4;
  reference puVar5;
  long in_FS_OFFSET;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar6;
  txiter in_stack_00000018;
  uint256 *txid;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__range1_1;
  uint256 *childHash;
  uint256 *hash;
  reverse_view<std::ranges::ref_view<const_std::vector<uint256,_std::allocator<uint256>_>_>_>
  *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  txiter childIter;
  Guard epoch_guard_5;
  iterator iter;
  txiter it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
  __end1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
  __begin1;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  txiter;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> descendants_to_remove;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> setAlreadyIncluded;
  cacheMap mapMemPoolDescendantsToUpdate;
  undefined4 in_stack_fffffffffffffd78;
  uint32_t in_stack_fffffffffffffd7c;
  CTxMemPool *in_stack_fffffffffffffd80;
  txiter in_stack_fffffffffffffd88;
  CTxMemPoolEntry *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
  in_stack_fffffffffffffdb8;
  bool local_229;
  undefined7 in_stack_fffffffffffffe08;
  MemPoolRemovalReason reason;
  CTransaction *origTx;
  txiter in_stack_fffffffffffffe30;
  txiter entry;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffff48;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffff50;
  cacheMap *in_stack_ffffffffffffff58;
  CTransaction local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffd88.node,(char *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd7c,(AnnotatedMixin<std::recursive_mutex> *)0x14212f8);
  std::map<$25c3d160$>::map
            ((map<_25c3d160_> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::vector<uint256,_std::allocator<uint256>_>::begin
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd80);
  std::vector<uint256,_std::allocator<uint256>_>::end
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd80);
  __last._M_current._6_1_ = in_stack_fffffffffffffdb6;
  __last._M_current._0_6_ = in_stack_fffffffffffffdb0;
  __last._M_current._7_1_ = in_stack_fffffffffffffdb7;
  std::set<uint256,std::less<uint256>,std::allocator<uint256>>::
  set<__gnu_cxx::__normal_iterator<uint256_const*,std::vector<uint256,std::allocator<uint256>>>>
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),in_stack_fffffffffffffdb8
             ,__last);
  _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  this_00 = (CTxMemPool *)
            std::ranges::views::__adaptor::
            operator|<const_std::ranges::views::_Reverse_&,_const_std::vector<uint256,_std::allocator<uint256>_>_&>
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd88.node,
                       (_Reverse *)in_stack_fffffffffffffd80);
  std::ranges::
  reverse_view<std::ranges::ref_view<const_std::vector<uint256,_std::allocator<uint256>_>_>_>::begin
            ((reverse_view<std::ranges::ref_view<const_std::vector<uint256,_std::allocator<uint256>_>_>_>
              *)in_stack_fffffffffffffd90);
  std::ranges::
  reverse_view<std::ranges::ref_view<const_std::vector<uint256,_std::allocator<uint256>_>_>_>::end
            ((reverse_view<std::ranges::ref_view<const_std::vector<uint256,_std::allocator<uint256>_>_>_>
              *)in_stack_fffffffffffffd90);
  while (uVar1 = std::
                 operator==<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                           ((reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                             *)in_stack_fffffffffffffd88.node,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                             *)in_stack_fffffffffffffd80), ((uVar1 ^ 0xff) & 1) != 0) {
    phVar3 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
              *)std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                             *)in_stack_fffffffffffffd80);
    entry.node = phVar3;
    boost::multi_index::detail::
    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
    ::find<uint256>((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                     *)in_stack_fffffffffffffd80,
                    (uint256 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    boost::multi_index::detail::
    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
    ::end((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
           *)in_stack_fffffffffffffd90);
    bVar2 = boost::multi_index::detail::operator==
                      ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffd88.node,
                       (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffd80);
    if (!bVar2) {
      transaction_identifier<false>::FromUint256
                ((uint256 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffffd88.node,(Txid *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd7c);
      indirectmap<COutPoint,_const_CTransaction_*>::lower_bound
                ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_fffffffffffffd88.node,
                 (COutPoint *)in_stack_fffffffffffffd80);
      Epoch::Guard::Guard((Guard *)in_stack_fffffffffffffd88.node,(Epoch *)in_stack_fffffffffffffd80
                         );
      while( true ) {
        indirectmap<COutPoint,_const_CTransaction_*>::end
                  ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_fffffffffffffd80);
        bVar2 = std::operator==((_Self *)in_stack_fffffffffffffd88.node,
                                (_Self *)in_stack_fffffffffffffd80);
        local_229 = false;
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          local_229 = transaction_identifier<false>::operator==
                                ((transaction_identifier<false> *)in_stack_fffffffffffffd88.node,
                                 (uint256 *)in_stack_fffffffffffffd80);
        }
        if (local_229 == false) break;
        std::_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        in_stack_fffffffffffffe30.node =
             (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
              *)transaction_identifier::operator_cast_to_uint256_
                          ((transaction_identifier<false> *)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        boost::multi_index::detail::
        hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
        ::find<uint256>((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                         *)in_stack_fffffffffffffd80,
                        (uint256 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        boost::multi_index::detail::
        hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
        ::end((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
               *)in_stack_fffffffffffffd90);
        bVar2 = boost::operators_impl::operator!=
                          ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                            *)in_stack_fffffffffffffd88.node,
                           (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                            *)in_stack_fffffffffffffd80);
        if (!bVar2) {
          __assert_fail("childIter != mapTx.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                        ,0x8b,
                        "void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256> &)"
                       );
        }
        bVar2 = visited(in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
        if ((!bVar2) &&
           (sVar4 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                               in_stack_fffffffffffffd88.node,(key_type *)in_stack_fffffffffffffd80)
           , sVar4 == 0)) {
          UpdateChild((CTxMemPool *)CONCAT17(uVar1,in_stack_fffffffffffffe08),entry,
                      in_stack_fffffffffffffe30,SUB81((ulong)phVar3 >> 0x38,0));
          UpdateParent((CTxMemPool *)CONCAT17(uVar1,in_stack_fffffffffffffe08),entry,
                       in_stack_fffffffffffffe30,SUB81((ulong)phVar3 >> 0x38,0));
        }
        std::_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      }
      Epoch::Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      UpdateForDescendants
                (this_00,in_stack_00000018,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  origTx = &local_98;
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffd80
            );
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::end
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffd80
            );
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffd88.node,
                                 (_Self *)in_stack_fffffffffffffd80), ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar5 = std::_Rb_tree_const_iterator<uint256>::operator*
                       ((_Rb_tree_const_iterator<uint256> *)
                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    reason = (MemPoolRemovalReason)((ulong)puVar5 >> 0x20);
    oVar6 = GetIter((CTxMemPool *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                    (uint256 *)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd9f =
         oVar6.
         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
         ._M_engaged;
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                        *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar2) {
      std::
      optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
      ::operator*((optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                   *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      in_stack_fffffffffffffd90 =
           boost::operators_impl::
           dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
           ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                         *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      in_stack_fffffffffffffd88.node =
           (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            *)CTxMemPoolEntry::GetTx
                        ((CTxMemPoolEntry *)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      removeRecursive((CTxMemPool *)in_stack_fffffffffffffe30.node,origTx,reason);
    }
    std::_Rb_tree_const_iterator<uint256>::operator++
              ((_Rb_tree_const_iterator<uint256> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::map<$25c3d160$>::~map
            ((map<_25c3d160_> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256>& vHashesToUpdate)
{
    AssertLockHeld(cs);
    // For each entry in vHashesToUpdate, store the set of in-mempool, but not
    // in-vHashesToUpdate transactions, so that we don't have to recalculate
    // descendants when we come across a previously seen entry.
    cacheMap mapMemPoolDescendantsToUpdate;

    // Use a set for lookups into vHashesToUpdate (these entries are already
    // accounted for in the state of their ancestors)
    std::set<uint256> setAlreadyIncluded(vHashesToUpdate.begin(), vHashesToUpdate.end());

    std::set<uint256> descendants_to_remove;

    // Iterate in reverse, so that whenever we are looking at a transaction
    // we are sure that all in-mempool descendants have already been processed.
    // This maximizes the benefit of the descendant cache and guarantees that
    // CTxMemPoolEntry::m_children will be updated, an assumption made in
    // UpdateForDescendants.
    for (const uint256& hash : vHashesToUpdate | std::views::reverse) {
        // calculate children from mapNextTx
        txiter it = mapTx.find(hash);
        if (it == mapTx.end()) {
            continue;
        }
        auto iter = mapNextTx.lower_bound(COutPoint(Txid::FromUint256(hash), 0));
        // First calculate the children, and update CTxMemPoolEntry::m_children to
        // include them, and update their CTxMemPoolEntry::m_parents to include this tx.
        // we cache the in-mempool children to avoid duplicate updates
        {
            WITH_FRESH_EPOCH(m_epoch);
            for (; iter != mapNextTx.end() && iter->first->hash == hash; ++iter) {
                const uint256 &childHash = iter->second->GetHash();
                txiter childIter = mapTx.find(childHash);
                assert(childIter != mapTx.end());
                // We can skip updating entries we've encountered before or that
                // are in the block (which are already accounted for).
                if (!visited(childIter) && !setAlreadyIncluded.count(childHash)) {
                    UpdateChild(it, childIter, true);
                    UpdateParent(childIter, it, true);
                }
            }
        } // release epoch guard for UpdateForDescendants
        UpdateForDescendants(it, mapMemPoolDescendantsToUpdate, setAlreadyIncluded, descendants_to_remove);
    }

    for (const auto& txid : descendants_to_remove) {
        // This txid may have been removed already in a prior call to removeRecursive.
        // Therefore we ensure it is not yet removed already.
        if (const std::optional<txiter> txiter = GetIter(txid)) {
            removeRecursive((*txiter)->GetTx(), MemPoolRemovalReason::SIZELIMIT);
        }
    }
}